

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

void uv__io_poll(uv_loop_t *loop,int timeout)

{
  uint __fd;
  long *plVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  bool bVar7;
  anon_union_8_2_39b8fc1f x;
  int _saved_errno;
  int reset_timeout;
  int user_timeout;
  int i;
  int op;
  int fd;
  int nfds;
  int count;
  int nevents;
  int have_signals;
  uint64_t base;
  uint64_t sigmask;
  sigset_t sigset;
  uv__io_t *w;
  QUEUE *q;
  int real_timeout;
  epoll_event e;
  epoll_event *pe;
  epoll_event events [1024];
  int local_1c;
  int local_18;
  int no_epoll_wait;
  int no_epoll_pwait;
  int timeout_local;
  uv_loop_t *loop_local;
  
  if (loop->nfds == 0) {
    if (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      __assert_fail("QUEUE_EMPTY(&loop->watcher_queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                    ,0x89,"void uv__io_poll(uv_loop_t *, int)");
    }
  }
  else {
    memset((void *)((long)&q + 4),0,0xc);
    while (loop->watcher_queue != (void **)loop->watcher_queue[0]) {
      plVar1 = (long *)loop->watcher_queue[0];
      *(long *)plVar1[1] = *plVar1;
      *(long *)(*plVar1 + 8) = plVar1[1];
      *plVar1 = (long)plVar1;
      plVar1[1] = (long)plVar1;
      sigset.__val[0xf] = (unsigned_long)(plVar1 + -3);
      if ((int)plVar1[2] == 0) {
        __assert_fail("w->pevents != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                      ,0x95,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)plVar1[3] < 0) {
        __assert_fail("w->fd >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                      ,0x96,"void uv__io_poll(uv_loop_t *, int)");
      }
      if ((int)loop->nwatchers <= (int)plVar1[3]) {
        __assert_fail("w->fd < (int) loop->nwatchers",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                      ,0x97,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._4_4_ = (undefined4)plVar1[2];
      real_timeout = (int)plVar1[3];
      if (*(int *)((long)plVar1 + 0x14) == 0) {
        user_timeout = 1;
      }
      else {
        user_timeout = 3;
      }
      iVar4 = epoll_ctl(loop->backend_fd,user_timeout,(int)plVar1[3],(epoll_event *)((long)&q + 4));
      if (iVar4 != 0) {
        piVar5 = __errno_location();
        if (*piVar5 != 0x11) {
          abort();
        }
        if (user_timeout != 1) {
          __assert_fail("op == EPOLL_CTL_ADD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                        ,0xa8,"void uv__io_poll(uv_loop_t *, int)");
        }
        iVar4 = epoll_ctl(loop->backend_fd,3,*(int *)(sigset.__val[0xf] + 0x30),
                          (epoll_event *)((long)&q + 4));
        if (iVar4 != 0) {
          abort();
        }
      }
      *(undefined4 *)(sigset.__val[0xf] + 0x2c) = *(undefined4 *)(sigset.__val[0xf] + 0x28);
    }
    bVar6 = (loop->flags & 1) != 0;
    if (bVar6) {
      sigemptyset((sigset_t *)&sigmask);
      sigaddset((sigset_t *)&sigmask,0x1b);
    }
    if (timeout < -1) {
      __assert_fail("timeout >= -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                    ,0xb9,"void uv__io_poll(uv_loop_t *, int)");
    }
    uVar2 = loop->time;
    fd = 0x30;
    bVar7 = (*loop->internal_fields & 1) == 0;
    if (bVar7) {
      _saved_errno = 0;
      no_epoll_wait = timeout;
    }
    else {
      no_epoll_wait = 0;
      _saved_errno = timeout;
    }
    bVar7 = !bVar7;
    local_18 = uv__io_poll::no_epoll_pwait_cached;
    local_1c = uv__io_poll::no_epoll_wait_cached;
    q._0_4_ = timeout;
    do {
      do {
        while( true ) {
          if (no_epoll_wait != 0) {
            uv__metrics_set_provider_entry_time(loop);
          }
          if (((bVar6) && (local_18 != 0)) &&
             (iVar4 = pthread_sigmask(0,(__sigset_t *)&sigmask,(__sigset_t *)0x0), iVar4 != 0)) {
            abort();
          }
          if ((local_1c != 0) || ((bVar6 && (local_18 == 0)))) {
            op = epoll_pwait(loop->backend_fd,(epoll_event *)&pe,0x400,no_epoll_wait,
                             (__sigset_t *)&sigmask);
            if ((op == -1) && (piVar5 = __errno_location(), *piVar5 == 0x26)) {
              uv__io_poll::no_epoll_pwait_cached = 1;
              local_18 = 1;
            }
          }
          else {
            op = epoll_wait(loop->backend_fd,(epoll_event *)&pe,0x400,no_epoll_wait);
            if ((op == -1) && (piVar5 = __errno_location(), *piVar5 == 0x26)) {
              uv__io_poll::no_epoll_wait_cached = 1;
              local_1c = 1;
            }
          }
          if (((bVar6) && (local_18 != 0)) &&
             (iVar4 = pthread_sigmask(1,(__sigset_t *)&sigmask,(__sigset_t *)0x0), iVar4 != 0)) {
            abort();
          }
          piVar5 = __errno_location();
          iVar4 = *piVar5;
          uv__update_time(loop);
          piVar5 = __errno_location();
          *piVar5 = iVar4;
          if (op == 0) break;
          if (op == -1) {
            piVar5 = __errno_location();
            if (*piVar5 == 0x26) {
              if ((local_1c != 0) && (local_18 != 0)) {
                __assert_fail("no_epoll_wait == 0 || no_epoll_pwait == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                              ,0x117,"void uv__io_poll(uv_loop_t *, int)");
              }
            }
            else {
              piVar5 = __errno_location();
              if (*piVar5 != 4) {
                abort();
              }
              if (bVar7) {
                no_epoll_wait = _saved_errno;
                bVar7 = false;
              }
              if (no_epoll_wait != -1) {
                if (no_epoll_wait == 0) {
                  return;
                }
                goto LAB_001bdd91;
              }
            }
          }
          else {
            bVar3 = false;
            nfds = 0;
            if (loop->watchers == (uv__io_t **)0x0) {
              __assert_fail("loop->watchers != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                            ,0x138,"void uv__io_poll(uv_loop_t *, int)");
            }
            loop->watchers[loop->nwatchers] = (uv__io_t *)&pe;
            loop->watchers[loop->nwatchers + 1] = (uv__io_t *)(long)op;
            for (reset_timeout = 0; reset_timeout < op; reset_timeout = reset_timeout + 1) {
              e.data.ptr = &events[(long)reset_timeout + -1].data;
              __fd = *(uint *)((long)&events[(long)reset_timeout + -1].data + 4);
              if (__fd != 0xffffffff) {
                if ((int)__fd < 0) {
                  __assert_fail("fd >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                                ,0x145,"void uv__io_poll(uv_loop_t *, int)");
                }
                if (loop->nwatchers <= __fd) {
                  __assert_fail("(unsigned) fd < loop->nwatchers",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                                ,0x146,"void uv__io_poll(uv_loop_t *, int)");
                }
                sigset.__val[0xf] = (unsigned_long)loop->watchers[(int)__fd];
                if ((uv__io_t *)sigset.__val[0xf] == (uv__io_t *)0x0) {
                  epoll_ctl(loop->backend_fd,2,__fd,(epoll_event *)e.data.ptr);
                }
                else {
                  *(uint *)e.data.ptr =
                       (((uv__io_t *)sigset.__val[0xf])->pevents | 0x18) & *e.data.ptr;
                  if ((*e.data.ptr == 8) || (*e.data.ptr == 0x10)) {
                    *(uint *)e.data.ptr =
                         ((uv__io_t *)sigset.__val[0xf])->pevents & 0x2007 | *e.data.ptr;
                  }
                  if (*e.data.ptr != 0) {
                    if ((uv__io_t *)sigset.__val[0xf] == &loop->signal_io_watcher) {
                      bVar3 = true;
                    }
                    else {
                      uv__metrics_update_idle_time(loop);
                      (**(code **)sigset.__val[0xf])(loop,sigset.__val[0xf],*e.data.ptr);
                    }
                    nfds = nfds + 1;
                  }
                }
              }
            }
            if (bVar7) {
              no_epoll_wait = _saved_errno;
              bVar7 = false;
            }
            if (bVar3) {
              uv__metrics_update_idle_time(loop);
              (*(loop->signal_io_watcher).cb)(loop,&loop->signal_io_watcher,1);
            }
            loop->watchers[loop->nwatchers] = (uv__io_t *)0x0;
            loop->watchers[loop->nwatchers + 1] = (uv__io_t *)0x0;
            if (bVar3) {
              return;
            }
            if (nfds == 0) {
              if (no_epoll_wait == 0) {
                return;
              }
              if (no_epoll_wait != -1) goto LAB_001bdd91;
            }
            else {
              if (op != 0x400) {
                return;
              }
              fd = fd + -1;
              if (fd == 0) {
                return;
              }
              no_epoll_wait = 0;
            }
          }
        }
        if (no_epoll_wait == -1) {
          __assert_fail("timeout != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                        ,0x101,"void uv__io_poll(uv_loop_t *, int)");
        }
        if (bVar7) {
          no_epoll_wait = _saved_errno;
          bVar7 = false;
        }
      } while (no_epoll_wait == -1);
      if (no_epoll_wait == 0) {
        return;
      }
LAB_001bdd91:
      if (no_epoll_wait < 1) {
        __assert_fail("timeout > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/epoll.c"
                      ,0x19d,"void uv__io_poll(uv_loop_t *, int)");
      }
      q._0_4_ = (int)q - ((int)loop->time - (int)uVar2);
      no_epoll_wait = (int)q;
    } while (0 < (int)q);
  }
  return;
}

Assistant:

void uv__io_poll(uv_loop_t* loop, int timeout) {
  /* A bug in kernels < 2.6.37 makes timeouts larger than ~30 minutes
   * effectively infinite on 32 bits architectures.  To avoid blocking
   * indefinitely, we cap the timeout and poll again if necessary.
   *
   * Note that "30 minutes" is a simplification because it depends on
   * the value of CONFIG_HZ.  The magic constant assumes CONFIG_HZ=1200,
   * that being the largest value I have seen in the wild (and only once.)
   */
  static const int max_safe_timeout = 1789569;
  static int no_epoll_pwait_cached;
  static int no_epoll_wait_cached;
  int no_epoll_pwait;
  int no_epoll_wait;
  struct epoll_event events[1024];
  struct epoll_event* pe;
  struct epoll_event e;
  int real_timeout;
  QUEUE* q;
  uv__io_t* w;
  sigset_t sigset;
  uint64_t sigmask;
  uint64_t base;
  int have_signals;
  int nevents;
  int count;
  int nfds;
  int fd;
  int op;
  int i;
  int user_timeout;
  int reset_timeout;

  if (loop->nfds == 0) {
    assert(QUEUE_EMPTY(&loop->watcher_queue));
    return;
  }

  memset(&e, 0, sizeof(e));

  while (!QUEUE_EMPTY(&loop->watcher_queue)) {
    q = QUEUE_HEAD(&loop->watcher_queue);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);

    w = QUEUE_DATA(q, uv__io_t, watcher_queue);
    assert(w->pevents != 0);
    assert(w->fd >= 0);
    assert(w->fd < (int) loop->nwatchers);

    e.events = w->pevents;
    e.data.fd = w->fd;

    if (w->events == 0)
      op = EPOLL_CTL_ADD;
    else
      op = EPOLL_CTL_MOD;

    /* XXX Future optimization: do EPOLL_CTL_MOD lazily if we stop watching
     * events, skip the syscall and squelch the events after epoll_wait().
     */
    if (epoll_ctl(loop->backend_fd, op, w->fd, &e)) {
      if (errno != EEXIST)
        abort();

      assert(op == EPOLL_CTL_ADD);

      /* We've reactivated a file descriptor that's been watched before. */
      if (epoll_ctl(loop->backend_fd, EPOLL_CTL_MOD, w->fd, &e))
        abort();
    }

    w->events = w->pevents;
  }

  sigmask = 0;
  if (loop->flags & UV_LOOP_BLOCK_SIGPROF) {
    sigemptyset(&sigset);
    sigaddset(&sigset, SIGPROF);
    sigmask |= 1 << (SIGPROF - 1);
  }

  assert(timeout >= -1);
  base = loop->time;
  count = 48; /* Benchmarks suggest this gives the best throughput. */
  real_timeout = timeout;

  if (uv__get_internal_fields(loop)->flags & UV_METRICS_IDLE_TIME) {
    reset_timeout = 1;
    user_timeout = timeout;
    timeout = 0;
  } else {
    reset_timeout = 0;
    user_timeout = 0;
  }

  /* You could argue there is a dependency between these two but
   * ultimately we don't care about their ordering with respect
   * to one another. Worst case, we make a few system calls that
   * could have been avoided because another thread already knows
   * they fail with ENOSYS. Hardly the end of the world.
   */
  no_epoll_pwait = uv__load_relaxed(&no_epoll_pwait_cached);
  no_epoll_wait = uv__load_relaxed(&no_epoll_wait_cached);

  for (;;) {
    /* Only need to set the provider_entry_time if timeout != 0. The function
     * will return early if the loop isn't configured with UV_METRICS_IDLE_TIME.
     */
    if (timeout != 0)
      uv__metrics_set_provider_entry_time(loop);

    /* See the comment for max_safe_timeout for an explanation of why
     * this is necessary.  Executive summary: kernel bug workaround.
     */
    if (sizeof(int32_t) == sizeof(long) && timeout >= max_safe_timeout)
      timeout = max_safe_timeout;

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_BLOCK, &sigset, NULL))
        abort();

    if (no_epoll_wait != 0 || (sigmask != 0 && no_epoll_pwait == 0)) {
      nfds = epoll_pwait(loop->backend_fd,
                         events,
                         ARRAY_SIZE(events),
                         timeout,
                         &sigset);
      if (nfds == -1 && errno == ENOSYS) {
        uv__store_relaxed(&no_epoll_pwait_cached, 1);
        no_epoll_pwait = 1;
      }
    } else {
      nfds = epoll_wait(loop->backend_fd,
                        events,
                        ARRAY_SIZE(events),
                        timeout);
      if (nfds == -1 && errno == ENOSYS) {
        uv__store_relaxed(&no_epoll_wait_cached, 1);
        no_epoll_wait = 1;
      }
    }

    if (sigmask != 0 && no_epoll_pwait != 0)
      if (pthread_sigmask(SIG_UNBLOCK, &sigset, NULL))
        abort();

    /* Update loop->time unconditionally. It's tempting to skip the update when
     * timeout == 0 (i.e. non-blocking poll) but there is no guarantee that the
     * operating system didn't reschedule our process while in the syscall.
     */
    SAVE_ERRNO(uv__update_time(loop));

    if (nfds == 0) {
      assert(timeout != -1);

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* We may have been inside the system call for longer than |timeout|
       * milliseconds so we need to update the timestamp to avoid drift.
       */
      goto update_timeout;
    }

    if (nfds == -1) {
      if (errno == ENOSYS) {
        /* epoll_wait() or epoll_pwait() failed, try the other system call. */
        assert(no_epoll_wait == 0 || no_epoll_pwait == 0);
        continue;
      }

      if (errno != EINTR)
        abort();

      if (reset_timeout != 0) {
        timeout = user_timeout;
        reset_timeout = 0;
      }

      if (timeout == -1)
        continue;

      if (timeout == 0)
        return;

      /* Interrupted by a signal. Update timeout and poll again. */
      goto update_timeout;
    }

    have_signals = 0;
    nevents = 0;

    {
      /* Squelch a -Waddress-of-packed-member warning with gcc >= 9. */
      union {
        struct epoll_event* events;
        uv__io_t* watchers;
      } x;

      x.events = events;
      assert(loop->watchers != NULL);
      loop->watchers[loop->nwatchers] = x.watchers;
      loop->watchers[loop->nwatchers + 1] = (void*) (uintptr_t) nfds;
    }

    for (i = 0; i < nfds; i++) {
      pe = events + i;
      fd = pe->data.fd;

      /* Skip invalidated events, see uv__platform_invalidate_fd */
      if (fd == -1)
        continue;

      assert(fd >= 0);
      assert((unsigned) fd < loop->nwatchers);

      w = loop->watchers[fd];

      if (w == NULL) {
        /* File descriptor that we've stopped watching, disarm it.
         *
         * Ignore all errors because we may be racing with another thread
         * when the file descriptor is closed.
         */
        epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, pe);
        continue;
      }

      /* Give users only events they're interested in. Prevents spurious
       * callbacks when previous callback invocation in this loop has stopped
       * the current watcher. Also, filters out events that users has not
       * requested us to watch.
       */
      pe->events &= w->pevents | POLLERR | POLLHUP;

      /* Work around an epoll quirk where it sometimes reports just the
       * EPOLLERR or EPOLLHUP event.  In order to force the event loop to
       * move forward, we merge in the read/write events that the watcher
       * is interested in; uv__read() and uv__write() will then deal with
       * the error or hangup in the usual fashion.
       *
       * Note to self: happens when epoll reports EPOLLIN|EPOLLHUP, the user
       * reads the available data, calls uv_read_stop(), then sometime later
       * calls uv_read_start() again.  By then, libuv has forgotten about the
       * hangup and the kernel won't report EPOLLIN again because there's
       * nothing left to read.  If anything, libuv is to blame here.  The
       * current hack is just a quick bandaid; to properly fix it, libuv
       * needs to remember the error/hangup event.  We should get that for
       * free when we switch over to edge-triggered I/O.
       */
      if (pe->events == POLLERR || pe->events == POLLHUP)
        pe->events |=
          w->pevents & (POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);

      if (pe->events != 0) {
        /* Run signal watchers last.  This also affects child process watchers
         * because those are implemented in terms of signal watchers.
         */
        if (w == &loop->signal_io_watcher) {
          have_signals = 1;
        } else {
          uv__metrics_update_idle_time(loop);
          w->cb(loop, w, pe->events);
        }

        nevents++;
      }
    }

    if (reset_timeout != 0) {
      timeout = user_timeout;
      reset_timeout = 0;
    }

    if (have_signals != 0) {
      uv__metrics_update_idle_time(loop);
      loop->signal_io_watcher.cb(loop, &loop->signal_io_watcher, POLLIN);
    }

    loop->watchers[loop->nwatchers] = NULL;
    loop->watchers[loop->nwatchers + 1] = NULL;

    if (have_signals != 0)
      return;  /* Event loop should cycle now so don't poll again. */

    if (nevents != 0) {
      if (nfds == ARRAY_SIZE(events) && --count != 0) {
        /* Poll for more events but don't block this time. */
        timeout = 0;
        continue;
      }
      return;
    }

    if (timeout == 0)
      return;

    if (timeout == -1)
      continue;

update_timeout:
    assert(timeout > 0);

    real_timeout -= (loop->time - base);
    if (real_timeout <= 0)
      return;

    timeout = real_timeout;
  }
}